

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_absolute_pose.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  void *pvVar3;
  size_type sVar4;
  size_type sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar9;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  timeval tVar20;
  timeval tVar21;
  size_t i_6;
  size_t i_5;
  transformation_t nonlinear_transformation_10;
  vector<int,_std::allocator<int>_> indices10;
  double nonlinear_time;
  size_t i_4;
  transformation_t nonlinear_transformation;
  rotation_t R_perturbed;
  translation_t t_perturbed;
  transformation_t epnp_transformation_6;
  vector<int,_std::allocator<int>_> indices6;
  double epnp_time;
  size_t i_3;
  transformation_t epnp_transformation;
  double p3p_gao_time;
  size_t i_2;
  transformations_t p3p_gao_transformations;
  double p3p_kneip_time;
  size_t i_1;
  transformations_t p3p_kneip_transformations;
  double p2p_time;
  size_t i;
  translation_t p2p_translation;
  size_t iterations;
  timeval toc;
  timeval tic;
  CentralAbsoluteAdapter adapter;
  MatrixXd gt;
  vector<int,_std::allocator<int>_> camCorrespondences;
  points_t points;
  bearingVectors_t bearingVectors;
  rotations_t camRotations;
  translations_t camOffsets;
  rotation_t rotation;
  translation_t position;
  size_t numberPoints;
  double outlierFraction;
  double noise;
  Matrix<double,_3,_4,_0,_3,_4> *other;
  AbsoluteAdapterBase *this;
  rotation_t *rotation_00;
  CentralAbsoluteAdapter *in_stack_fffffffffffff778;
  AbsoluteAdapterBase *in_stack_fffffffffffff780;
  int n;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffff788;
  AbsoluteAdapterBase *in_stack_fffffffffffff790;
  double in_stack_fffffffffffff7c0;
  rotations_t *in_stack_fffffffffffff7e0;
  translations_t *in_stack_fffffffffffff7e8;
  rotation_t *in_stack_fffffffffffff7f0;
  translation_t *in_stack_fffffffffffff7f8;
  rotation_t *in_stack_fffffffffffff800;
  translation_t *in_stack_fffffffffffff808;
  size_t in_stack_fffffffffffff848;
  size_t in_stack_fffffffffffff850;
  size_t in_stack_fffffffffffff858;
  AbsoluteAdapterBase *in_stack_fffffffffffff860;
  size_type local_690;
  ulong local_688;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff9b0;
  ostream *in_stack_fffffffffffff9b8;
  ulong local_568;
  bearingVectors_t *in_stack_fffffffffffffbc0;
  double in_stack_fffffffffffffbc8;
  double in_stack_fffffffffffffbd0;
  size_t in_stack_fffffffffffffbd8;
  rotations_t *in_stack_fffffffffffffbe0;
  translations_t *in_stack_fffffffffffffbe8;
  rotation_t *in_stack_fffffffffffffbf0;
  translation_t *in_stack_fffffffffffffbf8;
  points_t *in_stack_fffffffffffffc08;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc10;
  MatrixXd *in_stack_fffffffffffffc18;
  ulong local_388;
  double in_stack_fffffffffffffd20;
  ulong uVar22;
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_2d8;
  timeval local_2c0;
  timeval local_2b0;
  double local_2a0;
  ulong local_280;
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_278;
  timeval local_260;
  size_t in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  AbsoluteAdapterBase *in_stack_fffffffffffffdc0;
  ulong local_220;
  timeval local_1f8;
  timeval local_1e8 [8];
  undefined4 local_15c;
  undefined1 local_158 [48];
  Matrix<double,_3,_4,_0,_3,_4> local_128 [2];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_34;
  
  local_34 = 0;
  opengv::initializeRandomSeed();
  local_48 = 0;
  local_50 = 0;
  local_58 = 100;
  opengv::generateRandomTranslation(in_stack_fffffffffffff7c0);
  opengv::generateRandomRotation(in_stack_fffffffffffffd20);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x6c9419);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0x6c9426);
  opengv::generateCentralCameraSystem(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x6c944c);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x6c945b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6c946a);
  local_15c = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            (in_stack_fffffffffffff788,(int *)in_stack_fffffffffffff780,
             (unsigned_long *)in_stack_fffffffffffff778);
  rotation_00 = (rotation_t *)local_158;
  this = (AbsoluteAdapterBase *)(local_158 + 0x18);
  other = local_128;
  opengv::generateRandom2D3DCorrespondences
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
             in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffc08,
             in_stack_fffffffffffffc10,in_stack_fffffffffffffc18);
  opengv::printExperimentCharacteristics
            ((translation_t *)in_stack_fffffffffffff778,rotation_00,(double)this,(double)other);
  opengv::absolute_pose::CentralAbsoluteAdapter::CentralAbsoluteAdapter
            (in_stack_fffffffffffff778,(bearingVectors_t *)rotation_00,(points_t *)this,
             (rotation_t *)other);
  poVar1 = std::operator<<((ostream *)&std::cout,"running Kneip\'s P2P (first two correspondences)")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar9 = extraout_XMM0_Qb;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x6c959f);
  gettimeofday(local_1e8,(__timezone_ptr_t)0x0);
  for (local_220 = 0; local_220 < 0x32; local_220 = local_220 + 1) {
    opengv::absolute_pose::p2p
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)this,(Matrix<double,_3,_1,_0,_3,_1> *)other);
  }
  gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
  tVar20 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  local_260 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (double)tVar20.tv_sec;
  auVar10._0_8_ = (double)local_260.tv_usec;
  auVar10._8_8_ = uVar9;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar10,auVar15);
  auVar10 = vcvtusi2sd_avx512f(auVar10,0x32);
  dVar6 = auVar15._0_8_ / auVar10._0_8_;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "running Kneip\'s P3P (first three correspondences)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar9 = extraout_XMM0_Qb_00;
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            *)0x6c97e7);
  gettimeofday(local_1e8,(__timezone_ptr_t)0x0);
  for (local_280 = 0; local_280 < 0x32; local_280 = local_280 + 1) {
    opengv::absolute_pose::p3p_kneip
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::operator=((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 *)in_stack_fffffffffffff778,
                (vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 *)rotation_00);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
               *)in_stack_fffffffffffff778);
  }
  gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
  local_2b0 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  lVar2 = local_2b0.tv_sec;
  local_2c0 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (double)lVar2;
  auVar11._0_8_ = (double)local_2c0.tv_usec;
  auVar11._8_8_ = uVar9;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar11,auVar16);
  auVar10 = vcvtusi2sd_avx512f(auVar11,0x32);
  local_2a0 = auVar15._0_8_ / auVar10._0_8_;
  poVar1 = std::operator<<((ostream *)&std::cout,"running Gao\'s P3P (first three correspondences)")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar9 = extraout_XMM0_Qb_01;
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            *)0x6c99c1);
  gettimeofday(local_1e8,(__timezone_ptr_t)0x0);
  for (uVar22 = 0; uVar22 < 0x32; uVar22 = uVar22 + 1) {
    opengv::absolute_pose::p3p_gao
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::operator=((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 *)in_stack_fffffffffffff778,
                (vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 *)rotation_00);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
               *)in_stack_fffffffffffff778);
  }
  gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
  tVar20 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  tVar21 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (double)tVar20.tv_sec;
  auVar12._0_8_ = (double)tVar21.tv_usec;
  auVar12._8_8_ = uVar9;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar12,auVar17);
  auVar10 = vcvtusi2sd_avx512f(auVar12,0x32);
  poVar1 = std::operator<<((ostream *)&std::cout,"running epnp (all correspondences)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar9 = extraout_XMM0_Qb_02;
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x6c9b9b);
  gettimeofday(local_1e8,(__timezone_ptr_t)0x0);
  for (local_388 = 0; local_388 < 0x32; local_388 = local_388 + 1) {
    opengv::absolute_pose::epnp(in_stack_fffffffffffff780);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=((Matrix<double,_3,_4,_0,_3,_4> *)this,other);
  }
  gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
  tVar20 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  tVar21 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (double)tVar20.tv_sec;
  auVar13._0_8_ = (double)tVar21.tv_usec;
  auVar13._8_8_ = uVar9;
  auVar16 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar13,auVar18);
  auVar11 = vcvtusi2sd_avx512f(auVar13,0x32);
  dVar7 = auVar16._0_8_ / auVar11._0_8_;
  poVar1 = std::operator<<((ostream *)&std::cout,"running epnp with 6 correspondences");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  opengv::getNindices((int)((ulong)in_stack_fffffffffffff780 >> 0x20));
  opengv::absolute_pose::epnp
            (in_stack_fffffffffffff790,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff788);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose");
  poVar1 = std::operator<<((ostream *)&std::cout,"and performing nonlinear optimization");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x6c9dbb);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x6c9dca);
  uVar9 = 0;
  opengv::getPerturbedPose
            (in_stack_fffffffffffff808,in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             in_stack_fffffffffffff7f0,(double)in_stack_fffffffffffff7e8);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x6c9e08);
  gettimeofday(local_1e8,(__timezone_ptr_t)0x0);
  for (local_568 = 0; local_568 < 0x32; local_568 = local_568 + 1) {
    opengv::absolute_pose::AbsoluteAdapterBase::sett(this,(translation_t *)other);
    opengv::absolute_pose::AbsoluteAdapterBase::setR(this,(rotation_t *)other);
    opengv::absolute_pose::optimize_nonlinear(in_stack_fffffffffffff780);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=((Matrix<double,_3,_4,_0,_3,_4> *)this,other);
  }
  gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
  n = (int)((ulong)in_stack_fffffffffffff780 >> 0x20);
  tVar20 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  dVar8 = (double)tVar20.tv_sec;
  tVar20 = timeval_minus((timeval *)&local_1f8,(timeval *)local_1e8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar8;
  auVar14._0_8_ = (double)tVar20.tv_usec;
  auVar14._8_8_ = uVar9;
  auVar16 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar14,auVar19);
  auVar11 = vcvtusi2sd_avx512f(auVar14,0x32);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose");
  std::operator<<((ostream *)&std::cout,
                  "and performing nonlinear optimization with 10 correspondences");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  opengv::getNindices(n);
  opengv::getPerturbedPose
            (in_stack_fffffffffffff808,in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             in_stack_fffffffffffff7f0,(double)in_stack_fffffffffffff7e8);
  opengv::absolute_pose::AbsoluteAdapterBase::sett(this,(translation_t *)other);
  opengv::absolute_pose::AbsoluteAdapterBase::setR(this,(rotation_t *)other);
  opengv::absolute_pose::optimize_nonlinear
            (in_stack_fffffffffffff790,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff788);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from P2P algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from Kneip\'s P3P algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_688 = 0;
  while( true ) {
    sVar4 = std::
            vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            ::size(&local_278);
    if (sVar4 <= local_688) break;
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::operator[](&local_278,local_688);
    poVar1 = Eigen::operator<<(in_stack_fffffffffffff9b8,
                               (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                               in_stack_fffffffffffff9b0);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_688 = local_688 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from Gao\'s P3P algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_690 = 0;
  while( true ) {
    sVar4 = local_690;
    sVar5 = std::
            vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            ::size(&local_2d8);
    if (sVar5 <= sVar4) break;
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::operator[](&local_2d8,local_690);
    poVar1 = Eigen::operator<<(in_stack_fffffffffffff9b8,
                               (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                               in_stack_fffffffffffff9b0);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_690 = local_690 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from epnp algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff9b8,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                             in_stack_fffffffffffff9b0);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"results from epnp algorithm with only 6 correspondences:");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff9b8,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                             in_stack_fffffffffffff9b0);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from nonlinear algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff9b8,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                             in_stack_fffffffffffff9b0);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,
                  "results from nonlinear algorithm with only 10 correspondences:");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff9b8,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                             in_stack_fffffffffffff9b0);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from P2P algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,dVar6);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from Kneip\'s P3P algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,local_2a0);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from Gao\'s P3P algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar15._0_8_ / auVar10._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from epnp algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,dVar7);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from nonlinear algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar16._0_8_ / auVar11._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff778);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff778);
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             *)in_stack_fffffffffffff778);
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             *)in_stack_fffffffffffff778);
  opengv::absolute_pose::CentralAbsoluteAdapter::~CentralAbsoluteAdapter
            ((CentralAbsoluteAdapter *)0x6ca678);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x6ca685);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff778);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffff778);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffff778);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)in_stack_fffffffffffff778);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffff778);
  return local_34;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 100;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);
  
  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );
  
  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors;
  points_t points;
  std::vector<int> camCorrespondences; //unused in the central case!
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D3DCorrespondences(
      position, rotation, camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors, points, camCorrespondences, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a central absolute adapter
  absolute_pose::CentralAbsoluteAdapter adapter(
      bearingVectors,
      points,
      rotation );

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //run the experiments
  std::cout << "running Kneip's P2P (first two correspondences)" << std::endl;
  translation_t p2p_translation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p2p_translation = absolute_pose::p2p(adapter);
  gettimeofday( &toc, 0 );
  double p2p_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running Kneip's P3P (first three correspondences)" << std::endl;
  transformations_t p3p_kneip_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p3p_kneip_transformations = absolute_pose::p3p_kneip(adapter);
  gettimeofday( &toc, 0 );
  double p3p_kneip_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running Gao's P3P (first three correspondences)" << std::endl;
  transformations_t p3p_gao_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p3p_gao_transformations = absolute_pose::p3p_gao(adapter);
  gettimeofday( &toc, 0 );
  double p3p_gao_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running epnp (all correspondences)" << std::endl;
  transformation_t epnp_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    epnp_transformation = absolute_pose::epnp(adapter);
  gettimeofday( &toc, 0 );
  double epnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running epnp with 6 correspondences" << std::endl;
  std::vector<int> indices6 = getNindices(6);
  transformation_t epnp_transformation_6 =
      absolute_pose::epnp(adapter,indices6);

  std::cout << "setting perturbed pose";
  std::cout << "and performing nonlinear optimization" << std::endl;
  //add a small perturbation to the pose
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett(t_perturbed);
    adapter.setR(R_perturbed);
    nonlinear_transformation = absolute_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose";
  std::cout << "and performing nonlinear optimization with 10 correspondences";
  std::cout << std::endl;
  std::vector<int> indices10 = getNindices(10);
  //add a small perturbation to the pose
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  adapter.sett(t_perturbed);
  adapter.setR(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      absolute_pose::optimize_nonlinear(adapter,indices10);

  //print the results
  std::cout << "results from P2P algorithm:" << std::endl;
  std::cout << p2p_translation << std::endl << std::endl;
  std::cout << "results from Kneip's P3P algorithm:" << std::endl;
  for(size_t i = 0; i < p3p_kneip_transformations.size(); i++)
    std::cout << p3p_kneip_transformations[i] << std::endl << std::endl;
  std::cout << "results from Gao's P3P algorithm:" << std::endl;
  for(size_t i = 0; i < p3p_gao_transformations.size(); i++)
    std::cout << p3p_gao_transformations[i] << std::endl << std::endl;
  std::cout << "results from epnp algorithm:" << std::endl;
  std::cout << epnp_transformation << std::endl << std::endl;
  std::cout << "results from epnp algorithm with only 6 correspondences:";
  std::cout << std::endl;
  std::cout << epnp_transformation_6 << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only 10 correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from P2P algorithm: ";
  std::cout << p2p_time << std::endl;
  std::cout << "timings from Kneip's P3P algorithm: ";
  std::cout << p3p_kneip_time << std::endl;
  std::cout << "timings from Gao's P3P algorithm: ";
  std::cout << p3p_gao_time << std::endl;
  std::cout << "timings from epnp algorithm: ";
  std::cout << epnp_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}